

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  scoped_array<const_google::protobuf::FieldDescriptor_*> printer_00;
  int iVar1;
  FieldDescriptor **ppFVar2;
  FieldGenerator *pFVar3;
  int local_34;
  int local_30;
  int i_1;
  int i;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_20;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  sorted_fields.array_ = (FieldDescriptor **)printer;
  iVar1 = Descriptor::field_count(this->descriptor_);
  if (iVar1 != 0) {
    ppFVar2 = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::scoped_array
              (&local_20,ppFVar2);
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "\n@Override\npublic void writeTo(com.google.protobuf.nano.CodedOutputByteBufferNano output)\n    throws java.io.IOException {\n"
                      );
    io::Printer::Indent((Printer *)sorted_fields.array_);
    for (local_30 = 0; iVar1 = Descriptor::field_count(this->descriptor_),
        printer_00 = sorted_fields, local_30 < iVar1; local_30 = local_30 + 1) {
      ppFVar2 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_20,(long)local_30);
      GenerateSerializeOneField(this,(Printer *)printer_00.array_,*ppFVar2);
    }
    io::Printer::Print((Printer *)sorted_fields.array_,"super.writeTo(output);\n");
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"}\n");
    io::Printer::Print((Printer *)sorted_fields.array_,
                       "\n@Override\nprotected int computeSerializedSize() {\n  int size = super.computeSerializedSize();\n"
                      );
    io::Printer::Indent((Printer *)sorted_fields.array_);
    for (local_34 = 0; iVar1 = Descriptor::field_count(this->descriptor_), local_34 < iVar1;
        local_34 = local_34 + 1) {
      ppFVar2 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          (&local_20,(long)local_34);
      pFVar3 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar2);
      (*pFVar3->_vptr_FieldGenerator[9])(pFVar3,sorted_fields.array_);
    }
    io::Printer::Outdent((Printer *)sorted_fields.array_);
    io::Printer::Print((Printer *)sorted_fields.array_,"  return size;\n}\n");
    internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&local_20);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  // Rely on the parent implementations of writeTo() and getSerializedSize()
  // if there are no fields to serialize in this message.
  if (descriptor_->field_count() == 0) {
    return;
  }

  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  printer->Print(
    "\n"
    "@Override\n"
    "public void writeTo(com.google.protobuf.nano.CodedOutputByteBufferNano output)\n"
    "    throws java.io.IOException {\n");
  printer->Indent();

  // Output the fields in sorted order
  for (int i = 0; i < descriptor_->field_count(); i++) {
    GenerateSerializeOneField(printer, sorted_fields[i]);
  }

  // The parent implementation will write any unknown fields if necessary.
  printer->Print(
    "super.writeTo(output);\n");

  printer->Outdent();
  printer->Print("}\n");

  // The parent implementation will get the serialized size for unknown
  // fields if necessary.
  printer->Print(
    "\n"
    "@Override\n"
    "protected int computeSerializedSize() {\n"
    "  int size = super.computeSerializedSize();\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "  return size;\n"
    "}\n");
}